

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

int64_t absl::lts_20250127::anon_unknown_1::IDivSlowPath
                  (bool satq,Duration num,Duration den,Duration *rem)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  HiRep HVar6;
  uint uVar7;
  HiRep HVar8;
  HiRep HVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  HiRep HVar15;
  undefined1 auVar16 [16];
  
  uVar11 = den.rep_lo_;
  HVar6 = den.rep_hi_;
  uVar7 = num.rep_lo_;
  HVar9 = num.rep_hi_;
  uVar10 = (ulong)HVar6 ^ (ulong)HVar9;
  if ((uVar7 == 0xffffffff) || (HVar6 == (HiRep)0x0 && uVar11 == 0)) {
    HVar6.lo_ = 0;
    HVar6.hi_ = 0x80000000;
    if (-1 < (long)HVar9) {
      HVar6.lo_ = 0xffffffff;
      HVar6.hi_ = 0x7fffffff;
    }
    rem->rep_hi_ = HVar6;
    rem->rep_lo_ = 0xffffffff;
    if ((long)uVar10 < 0) {
      return -0x8000000000000000;
    }
    return 0x7fffffffffffffff;
  }
  if (uVar11 == 0xffffffff) {
    rem->rep_hi_ = HVar9;
    rem->rep_lo_ = uVar7;
    return 0;
  }
  uVar3 = 4000000000 - uVar7;
  if (-1 < (long)HVar9) {
    uVar3 = uVar7;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)HVar9 >> 0x3f ^ (ulong)HVar9;
  auVar1 = auVar1 * ZEXT816(4000000000) + ZEXT416(uVar3);
  uVar7 = 4000000000 - uVar11;
  if (-1 < (long)HVar6) {
    uVar7 = uVar11;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)HVar6 >> 0x3f ^ (ulong)HVar6;
  auVar2 = auVar2 * ZEXT816(4000000000) + ZEXT416(uVar7);
  auVar16 = __udivti3(auVar1._0_8_,auVar1._8_8_,auVar2._0_8_,auVar2._8_8_);
  HVar6 = auVar16._0_8_;
  HVar8.lo_ = 0;
  HVar8.hi_ = 0x80000000;
  HVar15 = HVar8;
  if (-1 < (long)uVar10) {
    HVar15.lo_ = 0xffffffff;
    HVar15.hi_ = 0x7fffffff;
  }
  uVar12 = 0;
  if (!satq) {
    uVar12 = auVar16._8_8_ & 0x1ffffffff;
    HVar15 = HVar6;
  }
  if (-1 < (long)HVar6 && auVar16._8_8_ == 0) {
    HVar15 = HVar6;
  }
  auVar16._8_8_ = uVar12;
  auVar16._0_4_ = HVar15.lo_;
  auVar16._4_4_ = HVar15.hi_;
  auVar1 = auVar1 - auVar2 * auVar16;
  uVar13 = auVar1._0_8_;
  uVar14 = auVar1._8_8_;
  if (uVar14 == 0) {
    HVar8 = (HiRep)(uVar13 / 4000000000);
    uVar4 = auVar1._0_4_ + HVar8.lo_ * 0x1194d800;
  }
  else {
    if (uVar14 < 2000000000) {
      HVar8 = (HiRep)__udivti3(uVar13 & 0xfffffffffffff800,uVar14,4000000000,0);
      uVar5 = HVar8.lo_ * 0x1194d800;
      uVar13 = (ulong)(auVar1._0_4_ + uVar5);
    }
    else {
      uVar13 = uVar13 | uVar14 ^ 2000000000;
      if (-1 < (long)HVar9) {
        HVar8.lo_ = 0xffffffff;
        HVar8.hi_ = 0x7fffffff;
      }
      uVar5 = -(uint)(-1 < (long)HVar9 || uVar13 != 0);
    }
    uVar4 = (uint32_t)uVar13;
    if (1999999999 < uVar14) goto LAB_00343272;
  }
  uVar5 = uVar4;
  if ((long)HVar9 < 0) {
    if (uVar5 == 0) {
      HVar8 = (HiRep)-(long)HVar8;
      uVar5 = 0;
    }
    else {
      HVar8 = (HiRep)~(ulong)HVar8;
      uVar5 = 4000000000 - uVar5;
    }
  }
LAB_00343272:
  rem->rep_hi_ = HVar8;
  rem->rep_lo_ = uVar5;
  if (((long)uVar10 < 0) && (uVar12 != 0 || HVar15 != (HiRep)0x0)) {
    uVar10 = -(long)HVar15 | 0x8000000000000000;
  }
  else {
    uVar10 = (ulong)HVar15 & 0x7fffffffffffffff;
  }
  return uVar10;
}

Assistant:

int64_t IDivSlowPath(bool satq, const Duration num, const Duration den,
                     Duration* rem) {
  const bool num_neg = num < ZeroDuration();
  const bool den_neg = den < ZeroDuration();
  const bool quotient_neg = num_neg != den_neg;

  if (time_internal::IsInfiniteDuration(num) || den == ZeroDuration()) {
    *rem = num_neg ? -InfiniteDuration() : InfiniteDuration();
    return quotient_neg ? kint64min : kint64max;
  }
  if (time_internal::IsInfiniteDuration(den)) {
    *rem = num;
    return 0;
  }

  const uint128 a = MakeU128Ticks(num);
  const uint128 b = MakeU128Ticks(den);
  uint128 quotient128 = a / b;

  if (satq) {
    // Limits the quotient to the range of int64_t.
    if (quotient128 > uint128(static_cast<uint64_t>(kint64max))) {
      quotient128 = quotient_neg ? uint128(static_cast<uint64_t>(kint64min))
                                 : uint128(static_cast<uint64_t>(kint64max));
    }
  }

  const uint128 remainder128 = a - quotient128 * b;
  *rem = MakeDurationFromU128(remainder128, num_neg);

  if (!quotient_neg || quotient128 == 0) {
    return Uint128Low64(quotient128) & kint64max;
  }
  // The quotient needs to be negated, but we need to carefully handle
  // quotient128s with the top bit on.
  return -static_cast<int64_t>(Uint128Low64(quotient128 - 1) & kint64max) - 1;
}